

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Pointer_Test::TestBody(PrintfTest_Pointer_Test *this)

{
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  wstring_view format_04;
  wstring_view format_05;
  wstring_view format_06;
  wstring_view format_07;
  wstring_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  wstring_view format_14;
  wstring_view format_15;
  wstring_view format_16;
  wstring_view format_17;
  wstring_view format_18;
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  wchar_t *null_wstr;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  wchar_t *w;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *null_str;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *s;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  void *p;
  int n;
  char (*in_stack_fffffffffffff4f8) [9];
  undefined7 in_stack_fffffffffffff500;
  undefined1 in_stack_fffffffffffff507;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff508;
  wstring *expected;
  char *in_stack_fffffffffffff510;
  Message *in_stack_fffffffffffff518;
  int line;
  Message *in_stack_fffffffffffff520;
  Type in_stack_fffffffffffff52c;
  Type type;
  AssertHelper *in_stack_fffffffffffff530;
  AssertHelper *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff538;
  undefined7 in_stack_fffffffffffff540;
  undefined1 in_stack_fffffffffffff547;
  char *in_stack_fffffffffffff548;
  Message *in_stack_fffffffffffff578;
  Message *message;
  AssertHelper *in_stack_fffffffffffff580;
  wstring local_8a8 [32];
  wstring local_888 [32];
  AssertionResult local_868 [3];
  AssertHelper local_838 [4];
  AssertionResult local_818;
  undefined8 local_808;
  wstring local_7e0 [32];
  wstring local_7c0 [32];
  wstring local_7a0 [32];
  AssertionResult local_780 [3];
  wstring local_750 [32];
  wstring local_730 [32];
  AssertionResult local_710;
  wchar_t *local_700;
  Message local_6d8 [4];
  wstring local_6b8 [32];
  AssertionResult local_698 [3];
  wstring local_668 [32];
  AssertionResult local_648 [3];
  wstring local_618 [32];
  wstring local_5f8 [32];
  AssertionResult local_5d8 [3];
  wstring local_5a8 [32];
  AssertionResult local_588 [3];
  wstring local_558 [32];
  wstring local_538 [32];
  wstring local_518 [32];
  AssertionResult local_4f8 [3];
  wstring local_4c8 [32];
  wstring local_4a8 [32];
  AssertionResult local_488 [3];
  string local_458 [32];
  string local_438 [32];
  AssertionResult local_418 [3];
  string local_3e8 [32];
  AssertionResult local_3c8;
  undefined8 local_3b8;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  AssertionResult local_330 [3];
  string local_300 [32];
  string local_2e0 [32];
  AssertionResult local_2c0;
  char *local_2b0;
  string local_288 [32];
  string local_268 [32];
  AssertionResult local_248 [3];
  string local_218 [32];
  AssertionResult local_1f8 [3];
  string local_1c8 [32];
  string local_1a8 [32];
  AssertionResult local_188 [3];
  string local_158 [32];
  AssertionResult local_138 [3];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  AssertionResult local_a8 [4];
  string local_68 [32];
  string local_48 [32];
  AssertionResult local_28;
  undefined1 *local_18;
  undefined1 local_c [12];
  
  local_18 = local_c;
  fmt::v5::format<char[3],void*>
            ((char (*) [3])in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format.data_._7_1_ = in_stack_fffffffffffff507;
  format.data_._0_7_ = in_stack_fffffffffffff500;
  format.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<void*>(format,(void **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               (char (*) [3])in_stack_fffffffffffff4f8);
    testing::AssertionResult::failure_message((AssertionResult *)0x134a31);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x134a94);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x134aec);
  fmt::v5::format<char[3],void*>
            ((char (*) [3])in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_09.data_._7_1_ = in_stack_fffffffffffff547;
  format_09.data_._0_7_ = in_stack_fffffffffffff540;
  format_09.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_09);
  fmt::v5::sprintf<std::__cxx11::string,void*>
            (in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x134c8e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x134cf1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x134d49);
  local_18 = (undefined1 *)0x0;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_00.data_._7_1_ = in_stack_fffffffffffff507;
  format_00.data_._0_7_ = in_stack_fffffffffffff500;
  format_00.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<void*>(format_00,(void **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (char (*) [6])in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               (char (*) [3])in_stack_fffffffffffff4f8);
    testing::AssertionResult::failure_message((AssertionResult *)0x134ea0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x134f03);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x134f5b);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_10.data_._7_1_ = in_stack_fffffffffffff547;
  format_10.data_._0_7_ = in_stack_fffffffffffff540;
  format_10.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_10);
  fmt::v5::sprintf<std::__cxx11::string,void*>
            (in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (char (*) [6])in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x1350b1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x135114);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13516c);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_01.data_._7_1_ = in_stack_fffffffffffff507;
  format_01.data_._0_7_ = in_stack_fffffffffffff500;
  format_01.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<void*>(format_01,(void **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (char (*) [11])in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               (char (*) [5])in_stack_fffffffffffff4f8);
    testing::AssertionResult::failure_message((AssertionResult *)0x1352b7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x13531a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135372);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_11.data_._7_1_ = in_stack_fffffffffffff547;
  format_11.data_._0_7_ = in_stack_fffffffffffff540;
  format_11.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_11);
  fmt::v5::sprintf<std::__cxx11::string,void*>
            (in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (char (*) [11])in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x1354c8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x13552b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135583);
  local_2b0 = "test";
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff538,(char **)in_stack_fffffffffffff530);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_02.data_._7_1_ = in_stack_fffffffffffff507;
  format_02.data_._0_7_ = in_stack_fffffffffffff500;
  format_02.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<char_const*>(format_02,(char **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               (char (*) [3])in_stack_fffffffffffff4f8);
    testing::AssertionResult::failure_message((AssertionResult *)0x135726);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x135789);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1357e1);
  fmt::v5::format<char[5],char_const*>
            ((char (*) [5])in_stack_fffffffffffff538,(char **)in_stack_fffffffffffff530);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_12.data_._7_1_ = in_stack_fffffffffffff547;
  format_12.data_._0_7_ = in_stack_fffffffffffff540;
  format_12.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_12);
  fmt::v5::sprintf<std::__cxx11::string,char_const*>
            (in_stack_fffffffffffff538,(char **)in_stack_fffffffffffff530);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x135983);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x1359e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135a3e);
  local_3b8 = 0;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_03.data_._7_1_ = in_stack_fffffffffffff507;
  format_03.data_._0_7_ = in_stack_fffffffffffff500;
  format_03.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<char_const*>(format_03,(char **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (char (*) [6])in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               (char (*) [3])in_stack_fffffffffffff4f8);
    testing::AssertionResult::failure_message((AssertionResult *)0x135b95);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x135bf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135c50);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             *in_stack_fffffffffffff4f8);
  format_13.data_._7_1_ = in_stack_fffffffffffff547;
  format_13.data_._0_7_ = in_stack_fffffffffffff540;
  format_13.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_13);
  fmt::v5::sprintf<std::__cxx11::string,char_const*>
            (in_stack_fffffffffffff538,(char **)in_stack_fffffffffffff530);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (char (*) [6])in_stack_fffffffffffff508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x135da6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x135e09);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135e61);
  local_18 = local_c;
  fmt::v5::format<wchar_t[3],void*>
            ((wchar_t (*) [3])in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_04.data_._7_1_ = in_stack_fffffffffffff507;
  format_04.data_._0_7_ = in_stack_fffffffffffff500;
  format_04.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<void*>(format_04,(void **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_4c8);
  std::__cxx11::wstring::~wstring(local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
               (wchar_t *)in_stack_fffffffffffff538);
    testing::AssertionResult::failure_message((AssertionResult *)0x136005);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x136068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1360c0);
  fmt::v5::format<wchar_t[3],void*>
            ((wchar_t (*) [3])in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_14.data_._7_1_ = in_stack_fffffffffffff547;
  format_14.data_._0_7_ = in_stack_fffffffffffff540;
  format_14.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_14);
  fmt::v5::sprintf<std::__cxx11::wstring,void*>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_538);
  std::__cxx11::wstring::~wstring(local_558);
  std::__cxx11::wstring::~wstring(local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x136262);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x1362c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13631d);
  local_18 = (undefined1 *)0x0;
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_05.data_._7_1_ = in_stack_fffffffffffff507;
  format_05.data_._0_7_ = in_stack_fffffffffffff500;
  format_05.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<void*>(format_05,(void **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<wchar_t[6],std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (wchar_t (*) [6])in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_5a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_588);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
               (wchar_t *)in_stack_fffffffffffff538);
    testing::AssertionResult::failure_message((AssertionResult *)0x136474);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x1364d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13652f);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_15.data_._7_1_ = in_stack_fffffffffffff547;
  format_15.data_._0_7_ = in_stack_fffffffffffff540;
  format_15.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_15);
  fmt::v5::sprintf<std::__cxx11::wstring,void*>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  testing::internal::EqHelper<false>::Compare<wchar_t[6],std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (wchar_t (*) [6])in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_5f8);
  std::__cxx11::wstring::~wstring(local_618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x136685);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x1366e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136740);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_06.data_._7_1_ = in_stack_fffffffffffff507;
  format_06.data_._0_7_ = in_stack_fffffffffffff500;
  format_06.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<void*>(format_06,(void **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<wchar_t[11],std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (wchar_t (*) [11])in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_668);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_648);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
               (wchar_t *)in_stack_fffffffffffff538);
    in_stack_fffffffffffff580 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13688b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x1368ee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136946);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  message = local_6d8;
  format_16.data_._7_1_ = in_stack_fffffffffffff547;
  format_16.data_._0_7_ = in_stack_fffffffffffff540;
  format_16.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_16);
  fmt::v5::sprintf<std::__cxx11::wstring,void*>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff538,&in_stack_fffffffffffff530->data_);
  testing::internal::EqHelper<false>::Compare<wchar_t[11],std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (wchar_t (*) [11])in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_6b8);
  std::__cxx11::wstring::~wstring((wstring *)local_6d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_698);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::AssertionResult::failure_message((AssertionResult *)0x136a96);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x136af3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136b4b);
  local_700 = L"test";
  fmt::v5::format<wchar_t[5],wchar_t_const*>
            ((wchar_t (*) [5])in_stack_fffffffffffff538,(wchar_t **)in_stack_fffffffffffff530);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_07.data_._7_1_ = in_stack_fffffffffffff507;
  format_07.data_._0_7_ = in_stack_fffffffffffff500;
  format_07.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<wchar_t_const*>(format_07,(wchar_t **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_750);
  std::__cxx11::wstring::~wstring(local_730);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_710);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
               in_stack_fffffffffffff4f8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff547,in_stack_fffffffffffff540),
               (wchar_t *)in_stack_fffffffffffff538);
    in_stack_fffffffffffff548 =
         testing::AssertionResult::failure_message((AssertionResult *)0x136cdf);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x136d39);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136d91);
  fmt::v5::format<wchar_t[5],wchar_t_const*>
            ((wchar_t (*) [5])in_stack_fffffffffffff538,(wchar_t **)in_stack_fffffffffffff530);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  format_17.data_._7_1_ = in_stack_fffffffffffff547;
  format_17.data_._0_7_ = in_stack_fffffffffffff540;
  format_17.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_17);
  fmt::v5::sprintf<std::__cxx11::wstring,wchar_t_const*>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff538,(wchar_t **)in_stack_fffffffffffff530);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring(local_7c0);
  std::__cxx11::wstring::~wstring(local_7e0);
  std::__cxx11::wstring::~wstring(local_7a0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_780);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff530);
    in_stack_fffffffffffff538 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x136f2d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff530,in_stack_fffffffffffff52c,(char *)in_stack_fffffffffffff520
               ,(int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x136f8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x136fe2);
  local_808 = 0;
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  this_00 = local_838;
  format_08.data_._7_1_ = in_stack_fffffffffffff507;
  format_08.data_._0_7_ = in_stack_fffffffffffff500;
  format_08.size_ = (size_t)in_stack_fffffffffffff508;
  test_sprintf<wchar_t_const*>(format_08,(wchar_t **)in_stack_fffffffffffff4f8);
  testing::internal::EqHelper<false>::Compare<wchar_t[6],std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             (wchar_t (*) [6])in_stack_fffffffffffff508,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  std::__cxx11::wstring::~wstring((wstring *)local_838);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_818);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff52c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff520 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
                    in_stack_fffffffffffff4f8);
    in_stack_fffffffffffff518 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(uVar2,in_stack_fffffffffffff540),
                    (wchar_t *)in_stack_fffffffffffff538);
    in_stack_fffffffffffff510 =
         testing::AssertionResult::failure_message((AssertionResult *)0x137124);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffff520,
               (int)((ulong)in_stack_fffffffffffff518 >> 0x20),in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x13717e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1371d6);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500),
             (wchar_t *)in_stack_fffffffffffff4f8);
  expected = local_8a8;
  format_18.data_._7_1_ = uVar2;
  format_18.data_._0_7_ = in_stack_fffffffffffff540;
  format_18.size_ = (size_t)in_stack_fffffffffffff548;
  make_positional_abi_cxx11_(format_18);
  fmt::v5::sprintf<std::__cxx11::wstring,wchar_t_const*>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff538,(wchar_t **)this_00);
  testing::internal::EqHelper<false>::Compare<wchar_t[6],std::__cxx11::wstring>
            ((char *)in_stack_fffffffffffff518,in_stack_fffffffffffff510,(wchar_t (*) [6])expected,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffff507,in_stack_fffffffffffff500));
  line = (int)((ulong)in_stack_fffffffffffff518 >> 0x20);
  std::__cxx11::wstring::~wstring(local_888);
  std::__cxx11::wstring::~wstring(local_8a8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_868);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x137320);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffff520,line,in_stack_fffffffffffff510);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff580,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff500));
    testing::Message::~Message((Message *)0x13737b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1373d0);
  return;
}

Assistant:

TEST(PrintfTest, Pointer) {
  int n;
  void *p = &n;
  EXPECT_PRINTF(fmt::format("{}", p), "%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", p);
  EXPECT_PRINTF("     (nil)", "%10p", p);
  const char *s = "test";
  EXPECT_PRINTF(fmt::format("{:p}", s), "%p", s);
  const char *null_str = FMT_NULL;
  EXPECT_PRINTF("(nil)", "%p", null_str);

  p = &n;
  EXPECT_PRINTF(fmt::format(L"{}", p), L"%p", p);
  p = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", p);
  EXPECT_PRINTF(L"     (nil)", L"%10p", p);
  const wchar_t *w = L"test";
  EXPECT_PRINTF(fmt::format(L"{:p}", w), L"%p", w);
  const wchar_t *null_wstr = FMT_NULL;
  EXPECT_PRINTF(L"(nil)", L"%p", null_wstr);
}